

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

void __thiscall TgBot::Api::deleteMessage(Api *this,int64_t chatId,int32_t messageId)

{
  long lVar1;
  initializer_list<TgBot::HttpReqArg> __l;
  allocator_type local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  allocator local_268;
  allocator local_267;
  allocator local_266;
  allocator local_265;
  int32_t messageId_local;
  int64_t chatId_local;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_258;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  ptree local_160;
  HttpReqArg local_138 [2];
  
  messageId_local = messageId;
  chatId_local = chatId;
  std::__cxx11::string::string((string *)&local_180,"deleteMessage",&local_265);
  std::__cxx11::string::string((string *)&local_1a0,"chat_id",&local_266);
  std::__cxx11::string::string((string *)&local_1c0,"text/plain",&local_267);
  std::__cxx11::string::string((string *)&local_1e0,"",&local_268);
  HttpReqArg::HttpReqArg<long>(local_138,&local_1a0,&chatId_local,false,&local_1c0,&local_1e0);
  std::__cxx11::string::string((string *)&local_200,"message_id",&local_269);
  std::__cxx11::string::string((string *)&local_220,"text/plain",&local_26a);
  std::__cxx11::string::string((string *)&local_240,"",&local_26b);
  HttpReqArg::HttpReqArg<int>(local_138 + 1,&local_200,&messageId_local,false,&local_220,&local_240)
  ;
  __l._M_len = 2;
  __l._M_array = local_138;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            (&local_258,__l,&local_26c);
  sendRequest(&local_160,this,&local_180,&local_258);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_160);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_258);
  lVar1 = 0x88;
  do {
    HttpReqArg::~HttpReqArg((HttpReqArg *)((long)&local_138[0].name._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  return;
}

Assistant:

void Api::deleteMessage(int64_t chatId, int32_t messageId) const {
    sendRequest("deleteMessage", { HttpReqArg("chat_id", chatId), HttpReqArg("message_id", messageId) });
}